

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disasm.c
# Opt level: O0

void bitaddr_memonic(int aValue,char *aBuffer)

{
  char local_28 [8];
  char regname [16];
  char *aBuffer_local;
  int aValue_local;
  
  regname._8_8_ = aBuffer;
  if (aValue < 0x80) {
    sprintf(local_28,"%02Xh",(ulong)(uint)(aValue >> 3));
  }
  else {
    switch(aValue & 0xf8) {
    case 0x80:
      strcpy(local_28,"P0");
      break;
    case 0x88:
      strcpy(local_28,"TCON");
      break;
    case 0x90:
      strcpy(local_28,"P1");
      break;
    case 0x98:
      strcpy(local_28,"SCON");
      break;
    case 0xa0:
      strcpy(local_28,"P2");
      break;
    case 0xa8:
      strcpy(local_28,"IE");
      break;
    case 0xb0:
      strcpy(local_28,"P3");
      break;
    case 0xb8:
      strcpy(local_28,"IP");
      break;
    default:
      sprintf(local_28,"%02Xh",(ulong)(aValue & 0xf8));
      break;
    case 0xd0:
      strcpy(local_28,"PSW");
      break;
    case 0xe0:
      strcpy(local_28,"ACC");
      break;
    case 0xf0:
      strcpy(local_28,"B");
    }
  }
  sprintf((char *)regname._8_8_,"%s.%d",local_28,(ulong)(aValue & 7));
  return;
}

Assistant:

void bitaddr_memonic(int aValue, char *aBuffer)
{
    char regname[16];

    if (aValue > 0x7f)
    {
        switch ((aValue & 0xf8) - 0x80)
        {
        case REG_ACC:
            strcpy(regname, "ACC"); 
            break;
        case REG_B:
            strcpy(regname, "B");
            break;
        case REG_PSW:
            strcpy(regname, "PSW");
            break;
        case REG_SP:
            strcpy(regname, "SP");
            break;
        case REG_DPL:
            strcpy(regname, "DPL");
            break;
        case REG_DPH:
            strcpy(regname, "DPH");
            break;
        case REG_P0:
            strcpy(regname, "P0");
            break;
        case REG_P1:
            strcpy(regname, "P1");
            break;
        case REG_P2:
            strcpy(regname, "P2");
            break;
        case REG_P3:
            strcpy(regname, "P3");
            break;
        case REG_IP:
            strcpy(regname, "IP");
            break;
        case REG_IE:
            strcpy(regname, "IE");
            break;
        case REG_TMOD:
            strcpy(regname, "TMOD");
            break;
        case REG_TCON:
            strcpy(regname, "TCON");
            break;
        case REG_TH0:
            strcpy(regname, "TH0");
            break;
        case REG_TL0:
            strcpy(regname, "TL0");
            break;
        case REG_TH1:
            strcpy(regname, "TH1");
            break;
        case REG_TL1:
            strcpy(regname, "TL1");
            break;
        case REG_SCON:
            strcpy(regname, "SCON");
            break;
        case REG_PCON:
            strcpy(regname, "PCON");
            break;
        default:
            sprintf(regname, "%02Xh",(aValue & 0xF8));
            break;
        }
    }
    else
    {
        sprintf(regname, "%02Xh", aValue >> 3);
    }

    sprintf(aBuffer, "%s.%d", regname, aValue & 7);
}